

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_threadnames_tests.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* util_threadnames_tests::RenameEnMasse_abi_cxx11_(int num_threads)

{
  bool bVar1;
  int in_ESI;
  type *in_RDI;
  long in_FS_OFFSET;
  thread *thread;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  iterator __end1;
  iterator __begin1;
  int i;
  type RenameThisThread;
  mutex lock;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff38;
  vector<std::thread,_std::allocator<std::thread>_> *this;
  type *__args;
  vector<std::thread,_std::allocator<std::thread>_> *this_00;
  size_type in_stack_ffffffffffffff70;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffff78;
  int local_5c;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  vector<std::thread,_std::allocator<std::thread>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  __args = in_RDI;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff38);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_ffffffffffffff38);
  this = &local_48;
  std::mutex::mutex((mutex *)in_stack_ffffffffffffff38);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  for (local_5c = 0; local_5c < in_ESI; local_5c = local_5c + 1) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<util_threadnames_tests::RenameEnMasse[abi:cxx11](int)::__0&,int&>
              (this_00,__args,(int *)this);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::begin
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_RDI);
  std::vector<std::thread,_std::allocator<std::thread>_>::end
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                           ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)this,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
               *)in_stack_ffffffffffffff38);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)in_stack_ffffffffffffff38);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::set<std::string> RenameEnMasse(int num_threads)
{
    std::vector<std::thread> threads;
    std::set<std::string> names;
    std::mutex lock;

    auto RenameThisThread = [&](int i) {
        util::ThreadRename(TEST_THREAD_NAME_BASE + ToString(i));
        std::lock_guard<std::mutex> guard(lock);
        names.insert(util::ThreadGetInternalName());
    };

    threads.reserve(num_threads);
    for (int i = 0; i < num_threads; ++i) {
        threads.emplace_back(RenameThisThread, i);
    }

    for (std::thread& thread : threads) thread.join();

    return names;
}